

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O1

void ppMul4(word *c,word *a,word *b,void *stack)

{
  ppMul2(c,a,b,stack);
  ppMul2(c + 4,a + 2,b + 2,stack);
  *(word *)stack = a[2] ^ *a;
  *(word *)((long)stack + 8) = a[3] ^ a[1];
  *(word *)((long)stack + 0x10) = b[2] ^ *b;
  *(word *)((long)stack + 0x18) = b[3] ^ b[1];
  *(word *)((long)stack + 0x20) = c[4] ^ c[2];
  *(word *)((long)stack + 0x28) = c[5] ^ c[3];
  ppMul2(c + 2,(word *)stack,(word *)((long)stack + 0x10),(void *)((long)stack + 0x30));
  c[2] = c[2] ^ *(ulong *)((long)stack + 0x20) ^ *c;
  c[3] = c[3] ^ *(ulong *)((long)stack + 0x28) ^ c[1];
  c[4] = c[4] ^ *(ulong *)((long)stack + 0x20) ^ c[6];
  c[5] = c[5] ^ *(ulong *)((long)stack + 0x28) ^ c[7];
  return;
}

Assistant:

static void ppMul4(word c[8], const word a[4], const word b[4], void* stack)
{
	word* t = (word*)stack;
	ASSERT(wwIsDisjoint2(a, 4, c, 8));
	ASSERT(wwIsDisjoint2(b, 4, c, 8));
	// c1 || c0 <- a0 b0
	ppMul2(c, a, b, t);
	// c3 || c2 <- a1 b1
	ppMul2(c + 4, a + 2, b + 2, t);
	// t0 <- a0 + a1
	t[0] = a[0] ^ a[2];
	t[1] = a[1] ^ a[3];
	// t1 <- b0 + b1
	t[2] = b[0] ^ b[2];
	t[3] = b[1] ^ b[3];
	// t2 <- c1 + c2
	t[4] = c[2] ^ c[4];
	t[5] = c[3] ^ c[5];
	// c2 || c1 <- t0 t1
	ppMul2(c + 2, t, t + 2, t + 6);
	// c1 <- c1 + c0 + w2
	c[2] ^= c[0] ^ t[4];
	c[3] ^= c[1] ^ t[5];
	// c2 <- c2 + c3 + w2
	c[4] ^= c[6] ^ t[4];
	c[5] ^= c[7] ^ t[5];
}